

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::
GenerateInterfaceMembers(RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar3;
  Options *pOVar4;
  undefined1 in_R8B;
  undefined1 uVar5;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  FieldDescriptor local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string_view local_128;
  string_view local_118;
  FieldDescriptor local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string_view local_98;
  string_view local_88 [2];
  FieldDescriptor local_68;
  Printer *printer_local;
  RepeatedImmutableMessageFieldLiteGenerator *this_local;
  
  pPVar1 = (Printer *)this->descriptor_;
  local_68.field_20 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27)printer;
  printer_local = (Printer *)this;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_68,pOVar4);
  WriteFieldDocComment((java *)printer,pPVar1,&local_68,(Options *)0x0,(bool)in_R8B);
  java::Options::~Options((Options *)&local_68);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "$deprecation$java.util.List<$type$> \n    ${$get$capitalized_name$List$}$();\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_88[0]);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  end_varname_00._M_str = local_a8._M_str;
  end_varname_00._M_len = local_a8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_98,end_varname_00,pFVar2,local_b0);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_a8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_108,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_108,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_108);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"$deprecation$$type$ ${$get$capitalized_name$$}$(int index);\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_118);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  end_varname._M_str = local_138._M_str;
  end_varname._M_len = local_138._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_128,end_varname,pFVar2,local_140);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_138._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_198,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_198,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_198);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,"$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_1a8);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_1b8,local_1c8,pFVar2,local_1d0);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  // TODO: In the future, consider having methods specific to the
  // interface so that builders can choose dynamically to either return a
  // message or a nested builder, so that asking for the interface doesn't
  // cause a message to ever be built.
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<$type$> \n"
                 "    ${$get$capitalized_name$List$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$$type$ ${$get$capitalized_name$$}$(int index);\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  printer->Annotate("{", "}", descriptor_);
}